

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O1

bool miniminer_tests::sanity_check
               (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *transactions,
               map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               *bumpfees)

{
  _Rb_tree_header *p_Var1;
  shared_ptr<const_CTransaction> *psVar2;
  pointer psVar3;
  element_type *peVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  long lVar8;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var9;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it_00;
  pointer psVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  char cVar14;
  COutPoint outpoint_;
  key_type local_98;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var6 = (bumpfees->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(bumpfees->_M_t)._M_impl.super__Rb_tree_header;
  bVar13 = (_Rb_tree_header *)p_Var6 == p_Var1;
  if (!bVar13) {
    psVar10 = (transactions->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (transactions->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = (long)psVar2 - (long)psVar10 >> 6;
    do {
      if ((long)p_Var6[2]._M_parent < 0) {
        cVar14 = '\x01';
      }
      else if (p_Var6[2]._M_parent == (_Base_ptr)0x0) {
        cVar14 = '\x03';
      }
      else {
        _Stack_60._M_right = (_Base_ptr)CONCAT44(_Stack_60._M_right._4_4_,p_Var6[2]._M_color);
        local_68._0_4_ = p_Var6[1]._M_color;
        local_68._4_4_ = *(undefined4 *)&p_Var6[1].field_0x4;
        _Stack_60._0_8_ = p_Var6[1]._M_parent;
        _Stack_60._M_parent = p_Var6[1]._M_left;
        _Stack_60._M_left = p_Var6[1]._M_right;
        local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = local_68;
        __it_00._M_current = psVar10;
        __it._M_current = psVar10;
        lVar11 = lVar8 + 1;
        if (0 < lVar8) {
          do {
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                  *)&local_98,__it);
            _Var9._M_current = __it._M_current;
            if (bVar5) goto LAB_0045ad02;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                  *)&local_98,__it._M_current + 1);
            _Var9._M_current = __it._M_current + 1;
            if (bVar5) goto LAB_0045ad02;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                  *)&local_98,__it._M_current + 2);
            _Var9._M_current = __it._M_current + 2;
            if (bVar5) goto LAB_0045ad02;
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                  *)&local_98,__it._M_current + 3);
            _Var9._M_current = __it._M_current + 3;
            if (bVar5) goto LAB_0045ad02;
            lVar11 = lVar11 + -1;
            __it_00._M_current =
                 (shared_ptr<const_CTransaction> *)
                 ((long)&(psVar10->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + ((long)psVar2 - (long)psVar10 & 0xffffffffffffffc0U));
            __it._M_current = __it._M_current + 4;
          } while (1 < lVar11);
        }
        lVar11 = (long)psVar2 - (long)__it_00._M_current >> 4;
        if (lVar11 == 1) {
LAB_0045ace5:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                *)&local_98,__it_00);
          _Var9._M_current = __it_00._M_current;
          if (!bVar5) {
            _Var9._M_current = psVar2;
          }
        }
        else if (lVar11 == 2) {
LAB_0045accb:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                *)&local_98,__it_00);
          _Var9._M_current = __it_00._M_current;
          if (!bVar5) {
            __it_00._M_current = __it_00._M_current + 1;
            goto LAB_0045ace5;
          }
        }
        else {
          _Var9._M_current = psVar2;
          if ((lVar11 == 3) &&
             (bVar5 = __gnu_cxx::__ops::
                      _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                    *)&local_98,__it_00), _Var9._M_current = __it_00._M_current,
             !bVar5)) {
            __it_00._M_current = __it_00._M_current + 1;
            goto LAB_0045accb;
          }
        }
LAB_0045ad02:
        cVar14 = _Var9._M_current == psVar2;
      }
      if ((cVar14 != '\x03') && (cVar14 != '\0')) {
        if (!bVar13) {
          bVar13 = false;
          goto LAB_0045ae55;
        }
        break;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
      bVar13 = (_Rb_tree_header *)p_Var6 == p_Var1;
    } while (!bVar13);
  }
  psVar10 = (transactions->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (transactions->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar13 = psVar10 == psVar3;
  if (!bVar13) {
    do {
      peVar4 = (psVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (1 < (ulong)(((long)(peVar4->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar4->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))
      {
        _Stack_60._0_8_ = _Stack_60._0_8_ & 0xffffffff00000000;
        _Stack_60._M_parent = (_Base_ptr)0x0;
        _Stack_60._M_left = &_Stack_60;
        local_40 = 0;
        peVar4 = (psVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        _Stack_60._M_right = _Stack_60._M_left;
        if ((peVar4->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (peVar4->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar12 = 0;
          do {
            peVar4 = (psVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((long)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((long)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)
                  ((long)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            local_98.n = (uint32_t)uVar12;
            cVar7 = std::
                    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    ::find(&bumpfees->_M_t,&local_98);
            if ((_Rb_tree_header *)cVar7._M_node != p_Var1) {
              std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
              _M_insert_unique<long_const&>
                        ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                          *)local_68,(long *)&cVar7._M_node[2]._M_parent);
            }
            peVar4 = (psVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)(((long)(peVar4->vout).
                                           super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(peVar4->vout).
                                           super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333));
        }
        uVar12 = local_40;
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                   *)local_68);
        if (1 < uVar12) break;
      }
      psVar10 = psVar10 + 1;
      bVar13 = psVar10 == psVar3;
    } while (!bVar13);
  }
LAB_0045ae55:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar13;
}

Assistant:

static inline bool sanity_check(const std::vector<CTransactionRef>& transactions,
                                const std::map<COutPoint, CAmount>& bumpfees)
{
    // No negative bumpfees.
    for (const auto& [outpoint, fee] : bumpfees) {
        if (fee < 0) return false;
        if (fee == 0) continue;
        auto outpoint_ = outpoint; // structured bindings can't be captured in C++17, so we need to use a variable
        const bool found = std::any_of(transactions.cbegin(), transactions.cend(), [&](const auto& tx) {
            return outpoint_.hash == tx->GetHash() && outpoint_.n < tx->vout.size();
        });
        if (!found) return false;
    }
    for (const auto& tx : transactions) {
        // If tx has multiple outputs, they must all have the same bumpfee (if they exist).
        if (tx->vout.size() > 1) {
            std::set<CAmount> distinct_bumpfees;
            for (size_t i{0}; i < tx->vout.size(); ++i) {
                const auto bumpfee = bumpfees.find(COutPoint{tx->GetHash(), static_cast<uint32_t>(i)});
                if (bumpfee != bumpfees.end()) distinct_bumpfees.insert(bumpfee->second);
            }
            if (distinct_bumpfees.size() > 1) return false;
        }
    }
    return true;
}